

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O0

ListSegment *
duckdb::CreatePrimitiveSegment<long>
          (ListSegmentFunctions *param_1,ArenaAllocator *allocator,uint16_t capacity)

{
  ListSegment *pLVar1;
  uint16_t in_DX;
  ListSegment *segment;
  uint16_t in_stack_ffffffffffffffde;
  ArenaAllocator *in_stack_ffffffffffffffe0;
  
  pLVar1 = (ListSegment *)
           AllocatePrimitiveData<long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde);
  pLVar1->capacity = in_DX;
  pLVar1->count = 0;
  pLVar1->next = (ListSegment *)0x0;
  return pLVar1;
}

Assistant:

static ListSegment *CreatePrimitiveSegment(const ListSegmentFunctions &, ArenaAllocator &allocator, uint16_t capacity) {
	// allocate data and set the header
	auto segment = reinterpret_cast<ListSegment *>(AllocatePrimitiveData<T>(allocator, capacity));
	segment->capacity = capacity;
	segment->count = 0;
	segment->next = nullptr;
	return segment;
}